

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O0

void __thiscall Farm::editTruck(Farm *this)

{
  bool bVar1;
  __type_conflict _Var2;
  ostream *this_00;
  allocator local_141;
  string local_140 [32];
  undefined1 local_120 [40];
  Truck *truck;
  iterator __end1;
  iterator __begin1;
  vector<Truck,_std::allocator<Truck>_> *__range1;
  string local_d8 [32];
  undefined4 local_b8;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68 [48];
  double local_38;
  double capacity;
  string plate;
  Farm *this_local;
  
  std::__cxx11::string::string((string *)&capacity);
  std::operator<<((ostream *)&std::cout,"Enter truck\'s plate: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&capacity);
  std::__cxx11::string::string(local_68,(string *)&capacity);
  bVar1 = searchTruckByPlate(this,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d8,"Enter truck\'s new capacity: ",(allocator *)((long)&__range1 + 7));
    getDouble(&local_38,(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    __end1 = std::vector<Truck,_std::allocator<Truck>_>::begin(&this->trucks);
    truck = (Truck *)std::vector<Truck,_std::allocator<Truck>_>::end(&this->trucks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Truck_*,_std::vector<Truck,_std::allocator<Truck>_>_>
                                       *)&truck), bVar1) {
      local_120._32_8_ =
           __gnu_cxx::__normal_iterator<Truck_*,_std::vector<Truck,_std::allocator<Truck>_>_>::
           operator*(&__end1);
      Truck::getPlate_abi_cxx11_((Truck *)local_120);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &capacity);
      std::__cxx11::string::~string((string *)local_120);
      if (_Var2) {
        Truck::setCapacity((Truck *)local_120._32_8_,local_38);
        break;
      }
      __gnu_cxx::__normal_iterator<Truck_*,_std::vector<Truck,_std::allocator<Truck>_>_>::operator++
                (&__end1);
    }
    this->farmFileChanged = true;
    this_00 = std::operator<<((ostream *)&std::cout,"Truck successfully edited!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"ENTER to go back",&local_141);
    enterWait((string *)local_140);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    local_b8 = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"ERROR: It doesn\'t exist a truck with the given plate!",&local_89);
    cinERR((string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"ENTER to go back",&local_b1);
    enterWait((string *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    local_b8 = 1;
  }
  std::__cxx11::string::~string((string *)&capacity);
  return;
}

Assistant:

void Farm::editTruck() {
    string plate;
    double capacity;

    cout << "Enter truck's plate: ";
    getline(cin, plate);
    if(!searchTruckByPlate(plate)){
        cinERR("ERROR: It doesn't exist a truck with the given plate!");
        enterWait();
        return;
    }

    getDouble(capacity, "Enter truck's new capacity: ");

    for(auto &truck : trucks){
        if(truck.getPlate() == plate){
            truck.setCapacity(capacity);
            break;
        }
    }

    farmFileChanged = true;
    cout << "Truck successfully edited!" << endl;
    enterWait();
}